

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_setup(jit_State *J)

{
  TraceNo TVar1;
  ExitNo EVar2;
  TraceLink lnk;
  IRIns *pIVar3;
  jit_State *pjVar4;
  BCIns *pBVar5;
  jit_State *in_RDI;
  TraceNo root;
  ScEvEntry *unaff_retaddr;
  GCtrace *T;
  IRIns *ir;
  uint32_t i;
  GCtrace *in_stack_000000b8;
  jit_State *in_stack_000000c0;
  TraceError in_stack_ffffffffffffffcc;
  TraceLink TVar6;
  jit_State *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar7;
  int init;
  
  memset(in_RDI->slot,0,0x3fc);
  memset(in_RDI->chain,0,0xc6);
  memset(in_RDI->bpropcache,0,0x80);
  (in_RDI->scev).idx = 0x7fff;
  (in_RDI->scev).pc.ptr32 = 0;
  in_RDI->baseslot = 1;
  in_RDI->base = in_RDI->slot + in_RDI->baseslot;
  in_RDI->maxslot = 0;
  in_RDI->framedepth = 0;
  in_RDI->retdepth = 0;
  in_RDI->instunroll = in_RDI->param[9];
  in_RDI->loopunroll = in_RDI->param[10];
  in_RDI->tailcalled = 0;
  in_RDI->loopref = 0;
  in_RDI->bc_min = (BCIns *)0x0;
  in_RDI->bc_extent = 0xffffffff;
  TVar1 = in_RDI->parent;
  EVar2 = in_RDI->exitno;
  (in_RDI->fold).ins.field_0.ot = 0xd05;
  (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)EVar2;
  pjVar4 = in_RDI;
  lj_ir_emit((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  init = (int)((ulong)pjVar4 >> 0x20);
  for (uVar7 = 0; uVar7 < 3; uVar7 = uVar7 + 1) {
    pIVar3 = (in_RDI->cur).ir + (0x7fff - uVar7);
    (pIVar3->field_1).op12 = 0;
    (pIVar3->field_1).t.irt = (uint8_t)uVar7;
    (pIVar3->field_1).o = '\x16';
    (pIVar3->field_0).prev = 0;
  }
  (in_RDI->cur).nk = 0x7ffd;
  in_RDI->startpc = in_RDI->pc;
  (in_RDI->cur).startpc.ptr32 = (uint32_t)in_RDI->pc;
  if (in_RDI->parent == 0) {
    (in_RDI->cur).root = 0;
    (in_RDI->cur).startins = *in_RDI->pc;
    pBVar5 = rec_setup_root(in_RDI);
    in_RDI->pc = pBVar5;
    lj_snap_add(in_stack_ffffffffffffffd0);
    if (((in_RDI->cur).startins & 0xff) == 0x4f) {
      rec_for_loop((jit_State *)&ir->field_0,(BCIns *)T,unaff_retaddr,init);
    }
    else if (((in_RDI->cur).startins & 0xff) == 0x45) {
      in_RDI->startpc = (BCIns *)0x0;
    }
    if (0xf9 < in_RDI->pt->framesize + 1) {
      lj_trace_err(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    goto LAB_001a59ff;
  }
  pjVar4 = (jit_State *)(ulong)in_RDI->trace[in_RDI->parent].gcptr32;
  if ((pjVar4->cur).root == 0) {
    lnk = in_RDI->parent;
  }
  else {
    lnk = (TraceLink)(pjVar4->cur).root;
  }
  (in_RDI->cur).root = (TraceNo1)lnk;
  (in_RDI->cur).startins = 0x58;
  TVar6 = lnk;
  if ((in_RDI->exitno == 0) && (((pjVar4->cur).snap)->nent == '\0')) {
    if ((((GCproto *)in_RDI->pc <= in_RDI->pt + 1) || ((in_RDI->pc[-1] & 0xff) != 0x4e)) ||
       (in_RDI->pc[(ulong)(in_RDI->pc[-1] >> 0x10) - 0x8001] >> 0x10 != lnk)) goto LAB_001a58af;
    lj_snap_add(pjVar4);
    rec_for_loop((jit_State *)&ir->field_0,(BCIns *)T,unaff_retaddr,init);
  }
  else {
    in_RDI->startpc = (BCIns *)0x0;
LAB_001a58af:
    lj_snap_replay(in_stack_000000c0,in_stack_000000b8);
  }
  if ((in_RDI->param[3] <=
       (int)(uint)*(ushort *)((ulong)in_RDI->trace[(in_RDI->cur).root].gcptr32 + 0x4c)) ||
     (in_RDI->param[7] + in_RDI->param[8] <= (int)(uint)(pjVar4->cur).snap[in_RDI->exitno].count)) {
    lj_record_stop(pjVar4,TVar6,lnk);
  }
LAB_001a59ff:
  in_RDI->prev_pt = (GCproto *)0x0;
  in_RDI->prev_line = -1;
  return;
}

Assistant:

void lj_record_setup(jit_State *J)
{
  uint32_t i;

  /* Initialize state related to current trace. */
  memset(J->slot, 0, sizeof(J->slot));
  memset(J->chain, 0, sizeof(J->chain));
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  memset(J->rbchash, 0, sizeof(J->rbchash));
#endif
  memset(J->bpropcache, 0, sizeof(J->bpropcache));
  J->scev.idx = REF_NIL;
  setmref(J->scev.pc, NULL);

  J->baseslot = 1+LJ_FR2;  /* Invoking function is at base[-1-LJ_FR2]. */
  J->base = J->slot + J->baseslot;
  J->maxslot = 0;
  J->framedepth = 0;
  J->retdepth = 0;

  J->instunroll = J->param[JIT_P_instunroll];
  J->loopunroll = J->param[JIT_P_loopunroll];
  J->tailcalled = 0;
  J->loopref = 0;

  J->bc_min = NULL;  /* Means no limit. */
  J->bc_extent = ~(MSize)0;

  /* Emit instructions for fixed references. Also triggers initial IR alloc. */
  emitir_raw(IRT(IR_BASE, IRT_PGC), J->parent, J->exitno);
  for (i = 0; i <= 2; i++) {
    IRIns *ir = IR(REF_NIL-i);
    ir->i = 0;
    ir->t.irt = (uint8_t)(IRT_NIL+i);
    ir->o = IR_KPRI;
    ir->prev = 0;
  }
  J->cur.nk = REF_TRUE;

  J->startpc = J->pc;
  setmref(J->cur.startpc, J->pc);
  if (J->parent) {  /* Side trace. */
    GCtrace *T = traceref(J, J->parent);
    TraceNo root = T->root ? T->root : J->parent;
    J->cur.root = (uint16_t)root;
    J->cur.startins = BCINS_AD(BC_JMP, 0, 0);
    /* Check whether we could at least potentially form an extra loop. */
    if (J->exitno == 0 && T->snap[0].nent == 0) {
      /* We can narrow a FORL for some side traces, too. */
      if (J->pc > proto_bc(J->pt) && bc_op(J->pc[-1]) == BC_JFORI &&
	  bc_d(J->pc[bc_j(J->pc[-1])-1]) == root) {
	lj_snap_add(J);
	rec_for_loop(J, J->pc-1, &J->scev, 1);
	goto sidecheck;
      }
    } else {
      J->startpc = NULL;  /* Prevent forming an extra loop. */
    }
    lj_snap_replay(J, T);
  sidecheck:
    if (traceref(J, J->cur.root)->nchild >= J->param[JIT_P_maxside] ||
	T->snap[J->exitno].count >= J->param[JIT_P_hotexit] +
				    J->param[JIT_P_tryside]) {
      lj_record_stop(J, LJ_TRLINK_INTERP, 0);
    }
  } else {  /* Root trace. */
    J->cur.root = 0;
    J->cur.startins = *J->pc;
    J->pc = rec_setup_root(J);
    /* Note: the loop instruction itself is recorded at the end and not
    ** at the start! So snapshot #0 needs to point to the *next* instruction.
    */
    lj_snap_add(J);
    if (bc_op(J->cur.startins) == BC_FORL)
      rec_for_loop(J, J->pc-1, &J->scev, 1);
    else if (bc_op(J->cur.startins) == BC_ITERC)
      J->startpc = NULL;
    if (1 + J->pt->framesize >= LJ_MAX_JSLOTS)
      lj_trace_err(J, LJ_TRERR_STACKOV);
  }
#if LJ_HASPROFILE
  J->prev_pt = NULL;
  J->prev_line = -1;
#endif
#ifdef LUAJIT_ENABLE_CHECKHOOK
  /* Regularly check for instruction/line hooks from compiled code and
  ** exit to the interpreter if the hooks are set.
  **
  ** This is a compile-time option and disabled by default, since the
  ** hook checks may be quite expensive in tight loops.
  **
  ** Note this is only useful if hooks are *not* set most of the time.
  ** Use this only if you want to *asynchronously* interrupt the execution.
  **
  ** You can set the instruction hook via lua_sethook() with a count of 1
  ** from a signal handler or another native thread. Please have a look
  ** at the first few functions in luajit.c for an example (Ctrl-C handler).
  */
  {
    TRef tr = emitir(IRT(IR_XLOAD, IRT_U8),
		     lj_ir_kptr(J, &J2G(J)->hookmask), IRXLOAD_VOLATILE);
    tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (LUA_MASKLINE|LUA_MASKCOUNT)));
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, 0));
  }
#endif
}